

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_buffer_access.cpp
# Opt level: O3

void __thiscall
lower_buffer_access::lower_buffer_access::setup_buffer_access
          (lower_buffer_access *this,void *mem_ctx,ir_rvalue *deref,ir_rvalue **offset,
          uint *const_offset,bool *row_major,glsl_type **matrix_type,
          glsl_struct_field **struct_field,glsl_interface_packing packing)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  ir_node_type iVar4;
  ir_rvalue *piVar5;
  _func_int *p_Var6;
  bool bVar7;
  uint uVar8;
  ir_constant *piVar9;
  ir_dereference_record *this_00;
  ulong uVar10;
  operand oVar11;
  undefined4 extraout_var;
  operand b;
  ir_expression *piVar12;
  byte bVar13;
  glsl_type *pgVar14;
  glsl_type *t_1;
  operand oVar15;
  ir_dereference_record *this_01;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  
  piVar9 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
  oVar15.val = (ir_rvalue *)piVar9;
  ir_constant::ir_constant(piVar9,0,1);
  *offset = (ir_rvalue *)piVar9;
  bVar7 = is_dereferenced_thing_row_major((lower_buffer_access *)oVar15.val,deref);
  *row_major = bVar7;
  *matrix_type = (glsl_type *)0x0;
  if (deref != (ir_rvalue *)0x0) {
LAB_001ed183:
    do {
      switch((deref->super_ir_instruction).ir_type) {
      case ir_type_dereference_array:
        piVar5 = (ir_rvalue *)deref[1].super_ir_instruction._vptr_ir_instruction;
        pgVar14 = piVar5->type;
        bVar13 = pgVar14->matrix_columns;
        bVar7 = 1 < pgVar14->vector_elements;
        oVar15.val = (ir_rvalue *)CONCAT71((int7)((ulong)oVar15.val >> 8),bVar13 == 1 && bVar7);
        if (bVar13 == 1 && bVar7) {
          if ((*(uint *)&pgVar14->field_0x4 & 0xfc) < 0xc) {
            bVar13 = (char)*(uint *)&pgVar14->field_0x4 - 4;
            uVar8 = 4;
            if (bVar13 < 10) {
              uVar8 = *(uint *)(&DAT_0022a920 + (ulong)bVar13 * 4);
            }
            goto LAB_001ed477;
          }
LAB_001ed3d3:
          for (pgVar14 = deref->type; pgVar14->field_0x4 == '\x11';
              pgVar14 = (pgVar14->fields).array) {
          }
          if (pgVar14->field_0x4 != '\x10') {
            bVar7 = is_dereferenced_thing_row_major((lower_buffer_access *)oVar15.val,deref);
            if (packing == GLSL_INTERFACE_PACKING_STD430) {
              uVar8 = glsl_type::std430_array_stride(deref->type,bVar7);
            }
            else {
              uVar8 = glsl_type::std140_size(deref->type,bVar7);
              uVar8 = uVar8 + 0xf & 0xfffffff0;
            }
            goto LAB_001ed477;
          }
          iVar4 = (piVar5->super_ir_instruction).ir_type;
          deref = piVar5;
        }
        else {
          uVar8 = (*(uint *)&pgVar14->field_0x4 & 0xff) - 2;
          oVar15.val = (ir_rvalue *)(ulong)CONCAT31((int3)(uVar8 >> 8),uVar8 < 3 && 1 < bVar13);
          if ((uVar8 >= 3 || 1 >= bVar13) || (*row_major != true)) goto LAB_001ed3d3;
          bVar13 = (char)*(uint *)&pgVar14->field_0x4 - 4;
          uVar8 = 4;
          if (bVar13 < 10) {
            uVar8 = *(uint *)(&DAT_0022a920 + (ulong)bVar13 * 4);
          }
          *matrix_type = pgVar14;
LAB_001ed477:
          oVar11.val = (ir_rvalue *)deref[1].super_ir_instruction.super_exec_node.next;
          if ((oVar11.val)->type->field_0x4 == '\x01') {
            oVar11.val = &ir_builder::i2u(oVar11)->super_ir_rvalue;
          }
          oVar15.val = oVar11.val;
          iVar18 = (*((oVar11.val)->super_ir_instruction)._vptr_ir_instruction[6])
                             (oVar11.val,mem_ctx,0);
          if (CONCAT44(extraout_var,iVar18) == 0) {
            oVar15.val = *offset;
            b.val = (ir_rvalue *)exec_node::operator_new(0xb0,mem_ctx);
            ir_constant::ir_constant((ir_constant *)b.val,uVar8,1);
            oVar11.val = &ir_builder::mul(oVar11,b)->super_ir_rvalue;
            piVar12 = ir_builder::add(oVar15,oVar11);
            *offset = &piVar12->super_ir_rvalue;
          }
          else {
            *const_offset = *const_offset + uVar8 * *(int *)(CONCAT44(extraout_var,iVar18) + 0x28);
          }
          deref = (ir_rvalue *)deref[1].super_ir_instruction._vptr_ir_instruction;
          iVar4 = (deref->super_ir_instruction).ir_type;
        }
        if (ir_type_dereference_variable < iVar4) {
          return;
        }
        goto LAB_001ed183;
      case ir_type_dereference_record:
        p_Var6 = deref[1].super_ir_instruction._vptr_ir_instruction[4];
        if (*(int *)(p_Var6 + 0xc) == 0) {
          iVar18 = 0;
        }
        else {
          uVar16 = 0;
          iVar18 = 0;
          do {
            piVar9 = *(ir_constant **)(*(long *)(p_Var6 + 0x20) + uVar16 * 0x30);
            this_00 = (ir_dereference_record *)exec_node::operator_new(0x38,mem_ctx);
            this_01 = this_00;
            ir_dereference_record::ir_dereference_record
                      (this_00,(ir_rvalue *)deref[1].super_ir_instruction._vptr_ir_instruction,
                       *(char **)(*(long *)(p_Var6 + 0x20) + 8 + uVar16 * 0x30));
            bVar7 = is_dereferenced_thing_row_major
                              ((lower_buffer_access *)this_01,(ir_rvalue *)this_00);
            ralloc_free(this_00);
            oVar15.val = &piVar9->super_ir_rvalue;
            if (packing == GLSL_INTERFACE_PACKING_STD430) {
              uVar8 = glsl_type::std430_base_alignment((glsl_type *)piVar9,bVar7);
            }
            else {
              uVar8 = glsl_type::std140_base_alignment((glsl_type *)piVar9,bVar7);
            }
            iVar3 = *(int *)(*(long *)(p_Var6 + 0x20) + 0x14 + uVar16 * 0x30);
            if (iVar3 != -1) {
              iVar18 = iVar3;
            }
            uVar17 = (uVar8 + iVar18) - 1;
            uVar10 = (ulong)*(int *)&deref[1].super_ir_instruction.super_exec_node.next;
            if ((long)uVar10 < 0) {
              __assert_fail("deref_record->field_idx >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                            ,0x18e,
                            "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                           );
            }
            iVar18 = uVar17 - uVar17 % uVar8;
            if (uVar16 == uVar10) {
              if (struct_field != (glsl_struct_field **)0x0) {
                *struct_field = (glsl_struct_field *)(*(long *)(p_Var6 + 0x20) + uVar16 * 0x30);
              }
              break;
            }
            if (packing == GLSL_INTERFACE_PACKING_STD430) {
              oVar15.val = &piVar9->super_ir_rvalue;
              uVar17 = glsl_type::std430_size((glsl_type *)piVar9,bVar7);
            }
            else {
              oVar15.val = &piVar9->super_ir_rvalue;
              uVar17 = glsl_type::std140_size((glsl_type *)piVar9,bVar7);
            }
            cVar1 = *(char *)((long)&(piVar9->super_ir_rvalue).super_ir_instruction.
                                     _vptr_ir_instruction + 4);
            while (cVar1 == '\x11') {
              piVar9 = (ir_constant *)
                       ((anon_union_8_3_d6fb00c4_for_fields *)&(piVar9->super_ir_rvalue).type)->
                       array;
              cVar1 = *(char *)((long)&(piVar9->super_ir_rvalue).super_ir_instruction.
                                       _vptr_ir_instruction + 4);
            }
            iVar18 = uVar17 + iVar18;
            if (cVar1 == '\x0f') {
              uVar17 = (uVar8 - 1) + iVar18;
              iVar18 = uVar17 - uVar17 % uVar8;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(uint *)(p_Var6 + 0xc));
        }
        *const_offset = *const_offset + iVar18;
        deref = (ir_rvalue *)deref[1].super_ir_instruction._vptr_ir_instruction;
        iVar4 = (deref->super_ir_instruction).ir_type;
        break;
      case ir_type_dereference_variable:
        goto switchD_001ed19e_caseD_2;
      default:
        __assert_fail("!\"not reached\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                      ,0x1b8,
                      "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                     );
      case ir_type_swizzle:
        uVar2 = *(ushort *)&deref[1].super_ir_instruction.super_exec_node.next;
        if ((uVar2 & 0x700) != 0x100) {
          __assert_fail("deref_swizzle->mask.num_components == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                        ,0x1b0,
                        "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                       );
        }
        *const_offset = *const_offset + (uVar2 & 3) * 4;
        deref = (ir_rvalue *)deref[1].super_ir_instruction._vptr_ir_instruction;
        iVar4 = (deref->super_ir_instruction).ir_type;
      }
    } while (iVar4 < ir_type_constant);
  }
switchD_001ed19e_caseD_2:
  return;
}

Assistant:

void
lower_buffer_access::setup_buffer_access(void *mem_ctx,
                                         ir_rvalue *deref,
                                         ir_rvalue **offset,
                                         unsigned *const_offset,
                                         bool *row_major,
                                         const glsl_type **matrix_type,
                                         const glsl_struct_field **struct_field,
                                         enum glsl_interface_packing packing)
{
   *offset = new(mem_ctx) ir_constant(0u);
   *row_major = is_dereferenced_thing_row_major(deref);
   *matrix_type = NULL;

   /* Calculate the offset to the start of the region of the UBO
    * dereferenced by *rvalue.  This may be a variable offset if an
    * array dereference has a variable index.
    */
   while (deref) {
      switch (deref->ir_type) {
      case ir_type_dereference_variable: {
         deref = NULL;
         break;
      }

      case ir_type_dereference_array: {
         ir_dereference_array *deref_array = (ir_dereference_array *) deref;
         unsigned array_stride;
         if (deref_array->array->type->is_vector()) {
            /* We get this when storing or loading a component out of a vector
             * with a non-constant index. This happens for v[i] = f where v is
             * a vector (or m[i][j] = f where m is a matrix). If we don't
             * lower that here, it gets turned into v = vector_insert(v, i,
             * f), which loads the entire vector, modifies one component and
             * then write the entire thing back.  That breaks if another
             * thread or SIMD channel is modifying the same vector.
             */
            array_stride = 4;
            if (deref_array->array->type->is_64bit())
               array_stride *= 2;
         } else if (deref_array->array->type->is_matrix() && *row_major) {
            /* When loading a vector out of a row major matrix, the
             * step between the columns (vectors) is the size of a
             * float, while the step between the rows (elements of a
             * vector) is handled below in emit_ubo_loads.
             */
            array_stride = 4;
            if (deref_array->array->type->is_64bit())
               array_stride *= 2;
            *matrix_type = deref_array->array->type;
         } else if (deref_array->type->without_array()->is_interface()) {
            /* We're processing an array dereference of an interface instance
             * array. The thing being dereferenced *must* be a variable
             * dereference because interfaces cannot be embedded in other
             * types. In terms of calculating the offsets for the lowering
             * pass, we don't care about the array index. All elements of an
             * interface instance array will have the same offsets relative to
             * the base of the block that backs them.
             */
            deref = deref_array->array->as_dereference();
            break;
         } else {
            /* Whether or not the field is row-major (because it might be a
             * bvec2 or something) does not affect the array itself. We need
             * to know whether an array element in its entirety is row-major.
             */
            const bool array_row_major =
               is_dereferenced_thing_row_major(deref_array);

            /* The array type will give the correct interface packing
             * information
             */
            if (packing == GLSL_INTERFACE_PACKING_STD430) {
               array_stride = deref_array->type->std430_array_stride(array_row_major);
            } else {
               array_stride = deref_array->type->std140_size(array_row_major);
               array_stride = glsl_align(array_stride, 16);
            }
         }

         ir_rvalue *array_index = deref_array->array_index;
         if (array_index->type->base_type == GLSL_TYPE_INT)
            array_index = i2u(array_index);

         ir_constant *const_index =
            array_index->constant_expression_value(mem_ctx, NULL);
         if (const_index) {
            *const_offset += array_stride * const_index->value.u[0];
         } else {
            *offset = add(*offset,
                          mul(array_index,
                              new(mem_ctx) ir_constant(array_stride)));
         }
         deref = deref_array->array->as_dereference();
         break;
      }

      case ir_type_dereference_record: {
         ir_dereference_record *deref_record = (ir_dereference_record *) deref;
         const glsl_type *struct_type = deref_record->record->type;
         unsigned intra_struct_offset = 0;

         for (unsigned int i = 0; i < struct_type->length; i++) {
            const glsl_type *type = struct_type->fields.structure[i].type;

            ir_dereference_record *field_deref = new(mem_ctx)
               ir_dereference_record(deref_record->record,
                                     struct_type->fields.structure[i].name);
            const bool field_row_major =
               is_dereferenced_thing_row_major(field_deref);

            ralloc_free(field_deref);

            unsigned field_align = 0;

            if (packing == GLSL_INTERFACE_PACKING_STD430)
               field_align = type->std430_base_alignment(field_row_major);
            else
               field_align = type->std140_base_alignment(field_row_major);

            if (struct_type->fields.structure[i].offset != -1) {
               intra_struct_offset = struct_type->fields.structure[i].offset;
            }

            intra_struct_offset = glsl_align(intra_struct_offset, field_align);

            assert(deref_record->field_idx >= 0);
            if (i == (unsigned) deref_record->field_idx) {
               if (struct_field)
                  *struct_field = &struct_type->fields.structure[i];
               break;
            }

            if (packing == GLSL_INTERFACE_PACKING_STD430)
               intra_struct_offset += type->std430_size(field_row_major);
            else
               intra_struct_offset += type->std140_size(field_row_major);

            /* If the field just examined was itself a structure, apply rule
             * #9:
             *
             *     "The structure may have padding at the end; the base offset
             *     of the member following the sub-structure is rounded up to
             *     the next multiple of the base alignment of the structure."
             */
            if (type->without_array()->is_struct()) {
               intra_struct_offset = glsl_align(intra_struct_offset,
                                                field_align);

            }
         }

         *const_offset += intra_struct_offset;
         deref = deref_record->record->as_dereference();
         break;
      }

      case ir_type_swizzle: {
         ir_swizzle *deref_swizzle = (ir_swizzle *) deref;

         assert(deref_swizzle->mask.num_components == 1);

         *const_offset += deref_swizzle->mask.x * sizeof(int);
         deref = deref_swizzle->val->as_dereference();
         break;
      }

      default:
         assert(!"not reached");
         deref = NULL;
         break;
      }
   }
}